

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.h
# Opt level: O0

void __thiscall
OptionRecordDouble::OptionRecordDouble
          (OptionRecordDouble *this,string *Xname,string *Xdescription,bool Xadvanced,
          double *Xvalue_pointer,double Xlower_bound,double Xdefault_value,double Xupper_bound)

{
  string *in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R8;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  string local_80 [23];
  undefined1 in_stack_ffffffffffffff97;
  string *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  HighsOptionType in_stack_ffffffffffffffac;
  OptionRecord *in_stack_ffffffffffffffb0;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffa0,in_RSI);
  std::__cxx11::string::string(local_80,in_RDX);
  OptionRecord::OptionRecord
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  *in_RDI = &PTR__OptionRecordDouble_0096daf8;
  in_RDI[0xb] = in_R8;
  in_RDI[0xc] = in_XMM0_Qa;
  in_RDI[0xe] = in_XMM1_Qa;
  in_RDI[0xd] = in_XMM2_Qa;
  *(undefined8 *)in_RDI[0xb] = in_RDI[0xe];
  return;
}

Assistant:

OptionRecordDouble(std::string Xname, std::string Xdescription,
                     bool Xadvanced, double* Xvalue_pointer,
                     double Xlower_bound, double Xdefault_value,
                     double Xupper_bound)
      : OptionRecord(HighsOptionType::kDouble, Xname, Xdescription, Xadvanced) {
    value = Xvalue_pointer;
    lower_bound = Xlower_bound;
    default_value = Xdefault_value;
    upper_bound = Xupper_bound;
    *value = default_value;
  }